

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O3

void __thiscall callback_data::save_tensor_for_layer(callback_data *this,ggml_tensor *t)

{
  pointer *pppgVar1;
  long lVar2;
  ggml_context *pgVar3;
  size_t __size;
  ggml_tensor *pgVar4;
  void *pvVar5;
  undefined8 uVar6;
  vector<ggml_tensor*,std::allocator<ggml_tensor*>> *this_00;
  iterator __position;
  ggml_tensor *t_layer;
  ggml_tensor *local_40;
  long local_38;
  undefined8 uStack_30;
  undefined1 local_28;
  
  if (t->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
               ,0x45,"GGML_ASSERT(%s) failed","t->type == GGML_TYPE_F32");
  }
  if (this->ctx_ggml == (ggml_context *)0x0) {
    lVar2 = ggml_tensor_overhead();
    local_38 = this->n_layers * lVar2 * 3;
    uStack_30 = 0;
    local_28 = 1;
    pgVar3 = (ggml_context *)ggml_init();
    this->ctx_ggml = pgVar3;
  }
  __size = ggml_nbytes(t);
  pgVar4 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx_ggml,t->type,t->ne[0],t->ne[1]);
  local_40 = pgVar4;
  pvVar5 = malloc(__size);
  pgVar4->data = pvVar5;
  ggml_backend_tensor_get(t,pvVar5,0,__size);
  uVar6 = ggml_get_name(t);
  ggml_set_name(pgVar4,uVar6);
  if (this->is_eval_pos == true) {
    __position._M_current =
         (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = pgVar4;
      pppgVar1 = &(this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppgVar1 = *pppgVar1 + 1;
      return;
    }
    this_00 = (vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&this->v_pos;
  }
  else {
    __position._M_current =
         (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = pgVar4;
      pppgVar1 = &(this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppgVar1 = *pppgVar1 + 1;
      return;
    }
    this_00 = (vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&this->v_neg;
  }
  std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_realloc_insert<ggml_tensor*const&>
            (this_00,__position,&local_40);
  return;
}

Assistant:

void save_tensor_for_layer(struct ggml_tensor * t) {
        GGML_ASSERT(t->type == GGML_TYPE_F32);

        if (ctx_ggml == nullptr) {
            // alloc a new ctx_ggml if needed
            struct ggml_init_params params_ggml = {
                /*.mem_size   =*/ ggml_tensor_overhead() * n_layers * 3u,
                /*.mem_buffer =*/ NULL,
                /*.no_alloc   =*/ true,
            };
            ctx_ggml = ggml_init(params_ggml);
        }

        // copy tensor data
        auto n_bytes = ggml_nbytes(t);
        struct ggml_tensor * t_layer = ggml_new_tensor_2d(ctx_ggml, t->type, t->ne[0], t->ne[1]);
        t_layer->data = malloc(n_bytes); // TODO @ngxson : get rid of this malloc somehow
        ggml_backend_tensor_get(t, t_layer->data, 0, n_bytes);
        ggml_set_name(t_layer, ggml_get_name(t));
        //print_debug_tensor(t_layer);

        if (is_eval_pos) {
            v_pos.push_back(t_layer);
        } else {
            v_neg.push_back(t_layer);
        }
    }